

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Graph::show_node_info(Graph *this)

{
  ostream *poVar1;
  long lVar2;
  int i;
  long lVar3;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"idx,x,y,demand,tw_open,tw_close,unload_time");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < this->num_node; lVar3 = lVar3 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,*(int *)((long)&this->nodes->idx + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->x + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->y + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->demand + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->tw_open + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->tw_close + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->unload_time + lVar2));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void Graph::show_node_info() const
{
	std::cout << std::endl << "idx,x,y,demand,tw_open,tw_close,unload_time" << std::endl;
	for(int i = 0; i < num_node; i++){
		std::cout << nodes[i].idx << " " << nodes[i].x << " " << nodes[i].y << " " << nodes[i].demand << \
			" " << nodes[i].tw_open << " " << nodes[i].tw_close << " " << nodes[i].unload_time << std::endl;
	}
}